

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QREncoder.cpp
# Opt level: O2

Version * ZXing::QRCode::ChooseVersion(int numInputBits,ErrorCorrectionLevel ecLevel)

{
  bool bVar1;
  Version *version;
  invalid_argument *this;
  int versionNum;
  int number;
  
  number = 1;
  do {
    if (number == 0x29) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Data too big");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    version = Version::Model2(number);
    bVar1 = WillFit(numInputBits,version,ecLevel);
    number = number + 1;
  } while (!bVar1);
  return version;
}

Assistant:

static const Version& ChooseVersion(int numInputBits, ErrorCorrectionLevel ecLevel)
{
	for (int versionNum = 1; versionNum <= 40; versionNum++) {
		const Version* version = Version::Model2(versionNum);
		if (WillFit(numInputBits, *version, ecLevel)) {
			return *version;
		}
	}
	throw std::invalid_argument("Data too big");
}